

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

void Sfm_TimCriticalPath_int(Sfm_Tim_t *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,int SlackMax)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int *piVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int Fill;
  int iVar8;
  int iVar9;
  long lVar10;
  
  pAVar1 = pObj->pNtk;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar5 + 1,(int)vPath);
  if (((long)iVar5 < 0) || ((pAVar1->vTravIds).nSize <= iVar5)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar2 = pObj->pNtk;
  iVar8 = pAVar2->nTravIds;
  if ((pAVar1->vTravIds).pArray[iVar5] != iVar8) {
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,Fill);
    if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar2->vTravIds).pArray[iVar5] = iVar8;
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                    ,0xa0,"void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)"
                   );
    }
    iVar5 = (pObj->vFanins).nSize;
    if (0 < iVar5) {
      lVar10 = 0;
      do {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar10]];
        uVar6 = *(uint *)&pObj_00->field_0x14 & 0xf;
        if (((uVar6 != 2) && (uVar6 != 5)) && ((pObj_00->vFanins).nSize != 0)) {
          if (uVar6 != 7) {
            __assert_fail("Abc_ObjIsNode(pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmTim.c"
                          ,0xa5,
                          "void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)"
                         );
          }
          uVar6 = pObj_00->Id;
          uVar7 = (ulong)uVar6;
          if ((int)uVar6 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          if (((p->vTimReqs).nSize <= (int)(uVar6 * 2)) || ((p->vTimArrs).nSize <= (int)(uVar6 * 2))
             ) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar3 = (p->vTimArrs).pArray;
          piVar4 = (p->vTimReqs).pArray;
          iVar9 = piVar4[uVar7 * 2] - piVar3[uVar7 * 2];
          iVar8 = piVar4[uVar7 * 2 + 1] - piVar3[uVar7 * 2 + 1];
          if (iVar9 < iVar8) {
            iVar8 = iVar9;
          }
          if (iVar8 <= SlackMax) {
            Sfm_TimCriticalPath_int(p,pObj_00,vPath,SlackMax);
            iVar5 = (pObj->vFanins).nSize;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar5);
      if (0 < iVar5) {
        Vec_IntPush(vPath,pObj->Id);
        return;
      }
    }
  }
  return;
}

Assistant:

void Sfm_TimCriticalPath_int( Sfm_Tim_t * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, int SlackMax )
{
    Abc_Obj_t * pNext; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, vPath, SlackMax );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}